

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_41511::extractDataPart
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *bstring)

{
  long lVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *extraout_RAX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  string dpstr;
  allocator_type local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  ulong local_30;
  pointer local_28;
  
  lVar1 = std::__cxx11::string::rfind((char)bstring,0x31);
  std::__cxx11::string::substr((ulong)&local_38,(ulong)bstring);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,bstring->_M_string_length - (lVar1 + 1),&local_39);
  if (local_30 != 0) {
    uVar2 = 0;
    do {
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar2] =
           *(uchar *)((long)&(local_38->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + uVar2);
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_30);
  }
  pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28;
  if (local_38 != pvVar3) {
    operator_delete(local_38,(ulong)(local_28 + 1));
    pvVar3 = extraout_RAX;
  }
  return pvVar3;
}

Assistant:

std::vector<unsigned char> extractDataPart(const std::string & bstring) {
        auto pos = findSeparatorPosition(bstring);
        std::string dpstr = bstring.substr(pos+1);
        // convert dpstr to dp vector
        std::vector<unsigned char> dp(bstring.size() - (pos + 1));
        for(std::string::size_type i = 0; i < dpstr.size(); ++i) {
            dp[i] = static_cast<unsigned char>(dpstr[i]);
        }
        return dp;
    }